

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsOptions.cpp
# Opt level: O2

bool boolFromString(string *value,bool *bool_value)

{
  pointer pcVar1;
  size_type sVar2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  bool bVar6;
  size_type sVar7;
  
  pcVar1 = (value->_M_dataplus)._M_p;
  sVar2 = value->_M_string_length;
  for (sVar7 = 0; sVar2 != sVar7; sVar7 = sVar7 + 1) {
    iVar5 = tolower((uint)(byte)pcVar1[sVar7]);
    pcVar1[sVar7] = (char)iVar5;
  }
  bVar3 = std::operator==(value,"t");
  bVar6 = true;
  if ((((!bVar3) && (bVar3 = std::operator==(value,"true"), !bVar3)) &&
      (bVar3 = std::operator==(value,"1"), !bVar3)) &&
     (_Var4 = std::operator==(value,&kHighsOnString_abi_cxx11_), !_Var4)) {
    bVar3 = std::operator==(value,"f");
    if (((bVar3) || (bVar3 = std::operator==(value,"false"), bVar3)) ||
       (bVar3 = std::operator==(value,"0"), bVar3)) {
      bVar6 = false;
    }
    else {
      _Var4 = std::operator==(value,&kHighsOffString_abi_cxx11_);
      bVar6 = false;
      if (!_Var4) {
        return false;
      }
    }
  }
  *bool_value = bVar6;
  return true;
}

Assistant:

bool boolFromString(std::string value, bool& bool_value) {
  std::transform(value.begin(), value.end(), value.begin(),
                 [](unsigned char c) { return std::tolower(c); });
  if (value == "t" || value == "true" || value == "1" ||
      value == kHighsOnString) {
    bool_value = true;
  } else if (value == "f" || value == "false" || value == "0" ||
             value == kHighsOffString) {
    bool_value = false;
  } else {
    return false;
  }
  return true;
}